

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O2

void run_benchmark(char *name,_func_void_void_ptr_int *benchmark,_func_void_void_ptr *setup,
                  _func_void_void_ptr_int *teardown,void *data,int count,int iter)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  lVar4 = 0x7fffffffffffffff;
  iVar6 = 10;
  lVar7 = 0;
  lVar5 = 0;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    bench_setup(setup);
    iVar1 = gettime_i64();
    (*benchmark)(setup,(int)teardown);
    iVar2 = gettime_i64();
    lVar3 = iVar2 - iVar1;
    if (lVar3 < lVar4) {
      lVar4 = lVar3;
    }
    if (lVar5 < lVar3) {
      lVar5 = lVar3;
    }
    lVar7 = lVar7 + lVar3;
  }
  printf("%-30s, ",name);
  lVar3 = (long)(int)teardown;
  print_number((lVar4 * 1000000) / lVar3);
  printf("   , ");
  print_number((lVar7 * 100000) / lVar3);
  printf("   , ");
  print_number((lVar5 * 1000000) / lVar3);
  putchar(10);
  return;
}

Assistant:

static void run_benchmark(char *name, void (*benchmark)(void*, int), void (*setup)(void*), void (*teardown)(void*, int), void* data, int count, int iter) {
    int i;
    int64_t min = INT64_MAX;
    int64_t sum = 0;
    int64_t max = 0;
    for (i = 0; i < count; i++) {
        int64_t begin, total;
        if (setup != NULL) {
            setup(data);
        }
        begin = gettime_i64();
        benchmark(data, iter);
        total = gettime_i64() - begin;
        if (teardown != NULL) {
            teardown(data, iter);
        }
        if (total < min) {
            min = total;
        }
        if (total > max) {
            max = total;
        }
        sum += total;
    }
    /* ',' is used as a column delimiter */
    printf("%-30s, ", name);
    print_number(min * FP_MULT / iter);
    printf("   , ");
    print_number(((sum * FP_MULT) / count) / iter);
    printf("   , ");
    print_number(max * FP_MULT / iter);
    printf("\n");
}